

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O2

void __thiscall cmTestGenerator::GenerateOldStyle(cmTestGenerator *this,ostream *fout,Indent indent)

{
  char cVar1;
  cmTest *pcVar2;
  pointer pcVar3;
  size_type sVar4;
  ostream *poVar5;
  pointer pbVar6;
  size_type sVar7;
  pointer ppVar8;
  string local_98;
  pointer local_78;
  string *arg;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  string exe;
  
  this->TestGenerated = true;
  pcVar2 = this->Test;
  std::__cxx11::string::string
            ((string *)&exe,
             (string *)
             (pcVar2->Command).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  cmsys::SystemTools::ConvertToUnixSlashes(&exe);
  operator<<(fout,(cmScriptGeneratorIndent)indent.Level);
  std::operator<<(fout,"add_test(");
  std::__cxx11::string::string((string *)&local_98,(string *)&this->Test->Name);
  poVar5 = std::operator<<(fout,(string *)&local_98);
  poVar5 = std::operator<<(poVar5," \"");
  poVar5 = std::operator<<(poVar5,(string *)&exe);
  std::operator<<(poVar5,"\"");
  std::__cxx11::string::~string((string *)&local_98);
  local_78 = (pcVar2->Command).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pbVar6 = (pcVar2->Command).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while (pbVar6 + 1 != local_78) {
    arg = pbVar6 + 1;
    std::operator<<(fout," \"");
    pcVar3 = pbVar6[1]._M_dataplus._M_p;
    sVar4 = pbVar6[1]._M_string_length;
    for (sVar7 = 0; sVar4 != sVar7; sVar7 = sVar7 + 1) {
      cVar1 = pcVar3[sVar7];
      if (cVar1 == '\"') {
        std::operator<<(fout,'\\');
      }
      std::operator<<(fout,cVar1);
    }
    std::operator<<(fout,"\"");
    pbVar6 = arg;
  }
  poVar5 = std::operator<<(fout,")");
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = operator<<(fout,(cmScriptGeneratorIndent)indent.Level);
  poVar5 = std::operator<<(poVar5,"set_tests_properties(");
  std::__cxx11::string::string((string *)&local_98,(string *)&this->Test->Name);
  poVar5 = std::operator<<(poVar5,(string *)&local_98);
  std::operator<<(poVar5," PROPERTIES ");
  std::__cxx11::string::~string((string *)&local_98);
  cmPropertyMap::GetList_abi_cxx11_(&local_68,&this->Test->Properties);
  for (ppVar8 = local_68.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar8 != local_68.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar8 = ppVar8 + 1) {
    poVar5 = std::operator<<(fout," ");
    poVar5 = std::operator<<(poVar5,(string *)ppVar8);
    poVar5 = std::operator<<(poVar5," ");
    cmOutputConverter::EscapeForCMake(&local_98,&ppVar8->second);
    std::operator<<(poVar5,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_68);
  GenerateInternalProperties(this,fout);
  poVar5 = std::operator<<(fout,")");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::~string((string *)&exe);
  return;
}

Assistant:

void cmTestGenerator::GenerateOldStyle(std::ostream& fout, Indent indent)
{
  this->TestGenerated = true;

  // Get the test command line to be executed.
  std::vector<std::string> const& command = this->Test->GetCommand();

  std::string exe = command[0];
  cmSystemTools::ConvertToUnixSlashes(exe);
  fout << indent;
  fout << "add_test(";
  fout << this->Test->GetName() << " \"" << exe << "\"";

  for (std::string const& arg : cmMakeRange(command).advance(1)) {
    // Just double-quote all arguments so they are re-parsed
    // correctly by the test system.
    fout << " \"";
    for (char c : arg) {
      // Escape quotes within arguments.  We should escape
      // backslashes too but we cannot because it makes the result
      // inconsistent with previous behavior of this command.
      if (c == '"') {
        fout << '\\';
      }
      fout << c;
    }
    fout << "\"";
  }
  fout << ")" << std::endl;

  // Output properties for the test.
  fout << indent << "set_tests_properties(" << this->Test->GetName()
       << " PROPERTIES ";
  for (auto const& i : this->Test->GetProperties().GetList()) {
    fout << " " << i.first << " "
         << cmOutputConverter::EscapeForCMake(i.second);
  }
  this->GenerateInternalProperties(fout);
  fout << ")" << std::endl;
}